

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

LINE_SIDE rr::LineRasterUtil::getVertexSide(Vector<long,_2> *v,SubpixelLineSegment *l)

{
  bool bVar1;
  int i;
  LINE_SIDE LVar2;
  long lVar3;
  Vector<long,_2> v_1;
  Vector<long,_2> u;
  long local_38 [5];
  
  bVar1 = vertexOnLeftSideOfLine(v,l);
  LVar2 = LINE_SIDE_LEFT;
  if (!bVar1) {
    local_38[2] = 0;
    local_38[3] = 0;
    lVar3 = 0;
    do {
      local_38[lVar3 + 2] = (l->m_v1).m_data[lVar3] - (l->m_v0).m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    local_38[0] = 0;
    local_38[1] = 0;
    lVar3 = 0;
    do {
      local_38[lVar3] = v->m_data[lVar3] - (l->m_v0).m_data[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    LVar2 = LINE_SIDE_RIGHT;
    if (local_38[1] * local_38[2] - local_38[0] * local_38[3] < 1) {
      vertexOnLine(v,l);
      LVar2 = LINE_SIDE_INTERSECT;
    }
  }
  return LVar2;
}

Assistant:

static LINE_SIDE getVertexSide (const tcu::Vector<deInt64,2>& v, const SubpixelLineSegment& l)
{
	if (vertexOnLeftSideOfLine(v, l))
		return LINE_SIDE_LEFT;
	else if (vertexOnRightSideOfLine(v, l))
		return LINE_SIDE_RIGHT;
	else if (vertexOnLine(v, l))
		return LINE_SIDE_INTERSECT;
	else
	{
		DE_ASSERT(false);
		return LINE_SIDE_INTERSECT;
	}
}